

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

int sftp_cmd_open(sftp_command *cmd)

{
  int iVar1;
  int local_1c;
  int portnumber;
  sftp_command *cmd_local;
  
  if (backend == (Backend *)0x0) {
    if (cmd->nwords < 2) {
      printf("open: expects a host name\n");
      cmd_local._4_4_ = 0;
    }
    else {
      if (cmd->nwords < 3) {
        local_1c = 0;
      }
      else {
        local_1c = atoi(cmd->words[2]);
        if (local_1c == 0) {
          printf("open: invalid port number\n");
          return 0;
        }
      }
      iVar1 = psftp_connect(cmd->words[1],(char *)0x0,local_1c);
      if (iVar1 == 0) {
        do_sftp_init();
        cmd_local._4_4_ = 1;
      }
      else {
        backend = (Backend *)0x0;
        cmd_local._4_4_ = -1;
      }
    }
  }
  else {
    printf("psftp: already connected\n");
    cmd_local._4_4_ = 0;
  }
  return cmd_local._4_4_;
}

Assistant:

static int sftp_cmd_open(struct sftp_command *cmd)
{
    int portnumber;

    if (backend) {
        printf("psftp: already connected\n");
        return 0;
    }

    if (cmd->nwords < 2) {
        printf("open: expects a host name\n");
        return 0;
    }

    if (cmd->nwords > 2) {
        portnumber = atoi(cmd->words[2]);
        if (portnumber == 0) {
            printf("open: invalid port number\n");
            return 0;
        }
    } else
        portnumber = 0;

    if (psftp_connect(cmd->words[1], NULL, portnumber)) {
        backend = NULL;                /* connection is already closed */
        return -1;                     /* this is fatal */
    }
    do_sftp_init();
    return 1;
}